

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

Vec_Int_t * Pdr_ManCountFlops(Pdr_Man_t *p,Vec_Ptr_t *vCubes)

{
  uint uVar1;
  Vec_Int_t *p_00;
  void *pvVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  long lVar4;
  int i;
  
  p_00 = Vec_IntStart(p->pAig->nRegs);
  i = 0;
  do {
    if (vCubes->nSize <= i) {
      return p_00;
    }
    pvVar2 = Vec_PtrEntry(vCubes,i);
    if (*(int *)((long)pvVar2 + 8) != -1) {
      uVar3 = extraout_RDX;
      for (lVar4 = 0; lVar4 < *(int *)((long)pvVar2 + 0x10); lVar4 = lVar4 + 1) {
        uVar1 = *(uint *)((long)pvVar2 + lVar4 * 4 + 0x14);
        if (((int)uVar1 < 0) || (p->pAig->nRegs * 2 <= (int)uVar1)) {
          __assert_fail("pCube->Lits[n] >= 0 && pCube->Lits[n] < 2*Aig_ManRegNum(p->pAig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrInv.c"
                        ,0x82,"Vec_Int_t *Pdr_ManCountFlops(Pdr_Man_t *, Vec_Ptr_t *)");
        }
        Vec_IntAddToEntry(p_00,uVar1 >> 1,(int)uVar3);
        uVar3 = extraout_RDX_00;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Pdr_ManCountFlops( Pdr_Man_t * p, Vec_Ptr_t * vCubes )
{
    Vec_Int_t * vFlopCount;
    Pdr_Set_t * pCube;
    int i, n;
    vFlopCount = Vec_IntStart( Aig_ManRegNum(p->pAig) );
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 )
            continue;
        for ( n = 0; n < pCube->nLits; n++ )
        {
            assert( pCube->Lits[n] >= 0 && pCube->Lits[n] < 2*Aig_ManRegNum(p->pAig) );
            Vec_IntAddToEntry( vFlopCount, pCube->Lits[n] >> 1, 1 );
        }
    }
    return vFlopCount;
}